

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimetype.cpp
# Opt level: O1

QStringList * __thiscall QMimeType::suffixes(QStringList *__return_storage_ptr__,QMimeType *this)

{
  bool bVar1;
  QMimeDatabasePrivate *this_00;
  qsizetype qVar2;
  long lVar3;
  QString *this_01;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QString local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = QMimeDatabasePrivate::instance();
  QMimeDatabasePrivate::globPatterns((QStringList *)&local_58,this_00,&((this->d).d.ptr)->name);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QString>::reserve(__return_storage_ptr__,local_58.size);
  if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
    lVar3 = local_58.size * 0x18;
    this_01 = local_58.ptr;
    do {
      s.m_data = "*.";
      s.m_size = 2;
      bVar1 = QString::startsWith(this_01,s,CaseSensitive);
      if ((((bVar1) && (2 < (ulong)(this_01->d).size)) &&
          (qVar2 = QString::indexOf(this_01,(QChar)0x2a,2,CaseSensitive), qVar2 < 0)) &&
         (qVar2 = QString::indexOf(this_01,(QChar)0x3f,2,CaseSensitive), qVar2 < 0)) {
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QString::mid(&local_78,this_01,2,-1);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_78);
        QList<QString>::end(__return_storage_ptr__);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      this_01 = this_01 + 1;
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != 0);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QMimeType::suffixes() const
{
    const QStringList patterns = globPatterns();

    QStringList result;
    result.reserve(patterns.size());
    for (const QString &pattern : patterns) {
        // Not a simple suffix if it looks like: README or *. or *.* or *.JP*G or *.JP?
        if (pattern.startsWith("*."_L1) &&
            pattern.size() > 2 &&
            pattern.indexOf(u'*', 2) < 0 && pattern.indexOf(u'?', 2) < 0) {
            const QString suffix = pattern.mid(2);
            result.append(suffix);
        }
    }

    return result;
}